

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O0

void __thiscall Refal2::CReceptacle::DigOut(CReceptacle *this,CUnitList *key,CUnitList *value)

{
  CUnitNode *fromNode;
  bool bVar1;
  CNodeType *key_00;
  CUnitNode **ppCVar2;
  CNode<Refal2::CUnit> *pCVar3;
  CUnitNode *rightBorderNode;
  CUnitNode *equalNode;
  CUnitNode *leftBorderNode;
  CUnitList *value_local;
  CUnitList *key_local;
  CReceptacle *this_local;
  
  equalNode = (CUnitNode *)0x0;
  rightBorderNode = (CUnitNode *)0x0;
  leftBorderNode = (CUnitNode *)value;
  value_local = key;
  key_local = &this->data;
  key_00 = CNodeList<Refal2::CUnit>::GetFirst(&key->super_CNodeList<Refal2::CUnit>);
  bVar1 = find(this,key_00,&equalNode,&rightBorderNode);
  if (bVar1) {
    ppCVar2 = CUnit::PairedParen(&equalNode->super_CUnit);
    pCVar3 = *ppCVar2;
    rightBorderNode = CNode<Refal2::CUnit>::Next(rightBorderNode);
    if (rightBorderNode != pCVar3) {
      pCVar3 = CNode<Refal2::CUnit>::Prev(pCVar3);
      CNodeList<Refal2::CUnit>::Detach((CNodeList<Refal2::CUnit> *)this,rightBorderNode,pCVar3);
      CNodeList<Refal2::CUnit>::Assign
                ((CNodeList<Refal2::CUnit> *)leftBorderNode,rightBorderNode,pCVar3);
      fromNode = equalNode;
      ppCVar2 = CUnit::PairedParen(&equalNode->super_CUnit);
      CNodeList<Refal2::CUnit>::Remove((CNodeList<Refal2::CUnit> *)this,fromNode,*ppCVar2);
      return;
    }
  }
  CNodeList<Refal2::CUnit>::Empty((CNodeList<Refal2::CUnit> *)leftBorderNode);
  return;
}

Assistant:

void CReceptacle::DigOut( const CUnitList& key, CUnitList& value )
{
	CUnitNode* leftBorderNode = nullptr;
	CUnitNode* equalNode = nullptr;
	if( find( key.GetFirst(), leftBorderNode, equalNode ) ) {
		CUnitNode* rightBorderNode = leftBorderNode->PairedParen();
		equalNode = equalNode->Next();
		if( equalNode != rightBorderNode ) {
			rightBorderNode = rightBorderNode->Prev();
			data.Detach( equalNode, rightBorderNode );
			value.Assign( equalNode, rightBorderNode );
			data.Remove( leftBorderNode, leftBorderNode->PairedParen() );
			return;
		}
	}
	value.Empty();	
}